

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifftell(bifcxdef *ctx,int argc)

{
  runcxdef *ctx_00;
  FILE *__stream;
  long num;
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,(int *)0x0);
  ctx_00 = ctx->bifcxrun;
  num = ftell(__stream);
  runpnum(ctx_00,num);
  return;
}

Assistant:

void bifftell(bifcxdef *ctx, int argc)
{
    osfildef *fp;

    /* get the file number */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, 0);

    /* return the seek position */
    runpnum(ctx->bifcxrun, osfpos(fp));
}